

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flattexture.cpp
# Opt level: O1

void __thiscall FFlatTexture::MakeTexture(FFlatTexture *this)

{
  BYTE *buffer;
  long lVar1;
  long lVar2;
  size_t __n;
  ulong len;
  FWadLump lump;
  FWadLump FStack_48;
  
  FWadCollection::OpenLumpNum(&FStack_48,&Wads,(this->super_FTexture).SourceLump);
  len = (ulong)(this->super_FTexture).Height * (ulong)(this->super_FTexture).Width;
  buffer = (BYTE *)operator_new__(len);
  this->Pixels = buffer;
  lVar1 = FWadLump::Read(&FStack_48,buffer,len);
  lVar2 = (ulong)(this->super_FTexture).Height * (ulong)(this->super_FTexture).Width;
  __n = lVar2 - lVar1;
  if (__n != 0 && lVar1 <= lVar2) {
    memset(this->Pixels + lVar1,0xbb,__n);
  }
  FTexture::FlipSquareBlockRemap
            (this->Pixels,(uint)(this->super_FTexture).Width,(uint)(this->super_FTexture).Height,
             GPalette.Remap);
  FWadLump::~FWadLump(&FStack_48);
  return;
}

Assistant:

void FFlatTexture::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	Pixels = new BYTE[Width*Height];
	long numread = lump.Read (Pixels, Width*Height);
	if (numread < Width*Height)
	{
		memset (Pixels + numread, 0xBB, Width*Height - numread);
	}
	FlipSquareBlockRemap (Pixels, Width, Height, GPalette.Remap);
}